

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O0

int ON_BrepExtrudeFace(ON_Brep *brep,int face_index,ON_Curve *path_curve,bool bCap)

{
  ON_3dVector path_vector_00;
  ON_3dVector path_vector_01;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ON_BrepFace *pOVar6;
  int *piVar7;
  ON_BrepLoop *pOVar8;
  int *piVar9;
  ON_BrepLoop *pOVar10;
  int local_114;
  int fi;
  ON_BrepLoop *top_loop;
  ON_BrepFace *cap_face;
  int face_count1;
  ON_BrepLoop *loop;
  int local_b8;
  int local_b4;
  int outer_fli;
  int outer_loop_index;
  ON_BrepFace *face;
  int local_a0;
  int new_side_trim_count;
  int face_count0;
  int loop_count0;
  int local_88;
  int local_84;
  int fli;
  int li;
  ON_SimpleArray<int> side_face_index_loop_mark;
  ON_SimpleArray<int> side_face_index;
  ON_3dVector path_vector;
  uint local_30;
  int face_loop_count;
  int rc;
  bool bCap_local;
  ON_Curve *path_curve_local;
  int face_index_local;
  ON_Brep *brep_local;
  
  local_30 = 0;
  ON_Brep::DestroyMesh(brep,any_mesh);
  ON_Brep::DestroyRegionTopology(brep);
  if ((face_index < 0) ||
     (iVar3 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F),
     iVar3 <= face_index)) {
    brep_local._4_4_ = 0;
  }
  else {
    pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                       ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,face_index);
    iVar3 = ON_SimpleArray<int>::Count(&pOVar6->m_li);
    if (iVar3 < 1) {
      brep_local._4_4_ = 0;
    }
    else {
      pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                         ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,face_index);
      iVar4 = ON_SimpleArray<int>::Count(&pOVar6->m_li);
      if (iVar4 == 1) {
        pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                           ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,face_index);
        piVar7 = ON_SimpleArray<int>::operator[](&pOVar6->m_li,0);
        local_30 = ON_BrepExtrudeLoop(brep,*piVar7,path_curve,bCap);
      }
      else {
        ON_SimpleArray<int>::ON_SimpleArray
                  ((ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count);
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&fli);
        bVar2 = ON_BrepExtrudeHelper_CheckPathCurve
                          (path_curve,(ON_3dVector *)&side_face_index.m_count);
        if (bVar2) {
          new_side_trim_count =
               ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&brep->m_L);
          local_a0 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
          face._4_4_ = 0;
          for (local_88 = 0; local_88 < iVar3; local_88 = local_88 + 1) {
            pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                               ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,face_index);
            piVar7 = ON_SimpleArray<int>::operator[](&pOVar6->m_li,local_88);
            local_84 = *piVar7;
            if ((local_84 < 0) || (new_side_trim_count <= local_84)) {
              brep_local._4_4_ = 0;
              face_count0 = 1;
              goto LAB_0055354f;
            }
            bVar2 = ON_BrepExtrudeHelper_CheckLoop(brep,local_84);
            if (bVar2) {
              pOVar8 = ON_ClassArray<ON_BrepLoop>::operator[]
                                 ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,local_84);
              iVar4 = ON_SimpleArray<int>::Count(&pOVar8->m_ti);
              face._4_4_ = iVar4 + face._4_4_;
            }
          }
          if (face._4_4_ == 0) {
            brep_local._4_4_ = 0;
            face_count0 = 1;
          }
          else {
            ON_BrepExtrudeHelper_ReserveSpace(brep,face._4_4_,bCap & 1);
            ON_SimpleArray<int>::Reserve
                      ((ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count,(long)face._4_4_);
            ON_SimpleArray<int>::Reserve((ON_SimpleArray<int> *)&fli,(long)iVar3);
            _outer_fli = ON_ClassArray<ON_BrepFace>::operator[]
                                   ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,face_index);
            local_30 = 1;
            local_b4 = -1;
            local_b8 = -1;
            face_loop_count._3_1_ = bCap;
            for (local_88 = 0; local_88 < iVar3 && local_30 != 0; local_88 = local_88 + 1) {
              loop._4_4_ = ON_SimpleArray<int>::Count
                                     ((ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count);
              ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&fli,(int *)((long)&loop + 4));
              piVar7 = ON_SimpleArray<int>::operator[](&_outer_fli->m_li,local_88);
              local_84 = *piVar7;
              bVar2 = ON_BrepExtrudeHelper_CheckLoop(brep,local_84);
              if (bVar2) {
                pOVar8 = ON_ClassArray<ON_BrepLoop>::operator[]
                                   ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,local_84);
                if (((face_loop_count._3_1_ & 1) != 0) && (pOVar8->m_type == outer)) {
                  if (local_b4 < 0) {
                    local_b4 = local_84;
                    local_b8 = local_88;
                  }
                  else {
                    face_loop_count._3_1_ = 0;
                  }
                }
                bVar2 = ON_BrepExtrudeHelper_MakeSides
                                  (brep,local_84,path_curve,(bool)(face_loop_count._3_1_ & 1),
                                   (ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count);
                local_30 = (uint)bVar2;
              }
            }
            if ((((face_loop_count._3_1_ & 1) != 0) && (local_30 != 0)) && (-1 < local_b4)) {
              iVar5 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
              uVar1 = side_face_index._16_8_;
              iVar4 = local_b4;
              piVar7 = ON_SimpleArray<int>::Array
                                 ((ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count);
              piVar9 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&fli,local_b8);
              path_vector_00.y = path_vector.x;
              path_vector_00.x = (double)uVar1;
              path_vector_00.z = path_vector.y;
              bVar2 = ON_BrepExtrudeHelper_MakeCap(brep,iVar4,path_vector_00,piVar7 + *piVar9);
              if ((bVar2) &&
                 (iVar4 = ON_ClassArray<ON_BrepFace>::Count
                                    ((ON_ClassArray<ON_BrepFace> *)&brep->m_F), iVar5 < iVar4)) {
                local_30 = 2;
                iVar4 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
                pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                                   ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,iVar4 + -1);
                for (local_88 = 0; local_88 < iVar3; local_88 = local_88 + 1) {
                  piVar7 = ON_SimpleArray<int>::operator[](&_outer_fli->m_li,local_88);
                  local_84 = *piVar7;
                  if ((local_84 != local_b4) &&
                     (bVar2 = ON_BrepExtrudeHelper_CheckLoop(brep,local_84),
                     uVar1 = side_face_index._16_8_, iVar4 = local_84, bVar2)) {
                    piVar7 = ON_SimpleArray<int>::Array
                                       ((ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count);
                    piVar9 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&fli,local_88);
                    path_vector_01.y = path_vector.x;
                    path_vector_01.x = (double)uVar1;
                    path_vector_01.z = path_vector.y;
                    bVar2 = ON_BrepExtrudeHelper_MakeTopLoop
                                      (brep,pOVar6,iVar4,path_vector_01,piVar7 + *piVar9);
                    if (bVar2) {
                      iVar4 = ON_ClassArray<ON_BrepLoop>::Count
                                        ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L);
                      pOVar8 = ON_ClassArray<ON_BrepLoop>::operator[]
                                         ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,iVar4 + -1);
                      pOVar10 = ON_ClassArray<ON_BrepLoop>::operator[]
                                          ((ON_ClassArray<ON_BrepLoop> *)&brep->m_L,local_84);
                      pOVar8->m_type = pOVar10->m_type;
                    }
                  }
                }
              }
            }
            pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                               ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,face_index);
            if ((pOVar6->m_bRev & 1U) != 0) {
              for (local_114 = local_a0;
                  iVar3 = ON_ClassArray<ON_BrepFace>::Count
                                    ((ON_ClassArray<ON_BrepFace> *)&brep->m_F), local_114 < iVar3;
                  local_114 = local_114 + 1) {
                pOVar6 = ON_ClassArray<ON_BrepFace>::operator[]
                                   ((ON_ClassArray<ON_BrepFace> *)&brep->m_F,local_114);
                ON_Brep::FlipFace(brep,pOVar6);
              }
            }
            face_count0 = 0;
          }
        }
        else {
          brep_local._4_4_ = 0;
          face_count0 = 1;
        }
LAB_0055354f:
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&fli);
        ON_SimpleArray<int>::~ON_SimpleArray
                  ((ON_SimpleArray<int> *)&side_face_index_loop_mark.m_count);
        if (face_count0 != 0) {
          return brep_local._4_4_;
        }
      }
      brep_local._4_4_ = local_30;
    }
  }
  return brep_local._4_4_;
}

Assistant:

int ON_BrepExtrudeFace( 
          ON_Brep& brep,
          int face_index,
          const ON_Curve& path_curve,
          bool bCap
          )
{
  int rc = 0; // returns 1 for success with no cap, 2 for success with a cap

  brep.DestroyMesh(ON::any_mesh);
  brep.DestroyRegionTopology();

  if ( face_index < 0 || face_index >= brep.m_F.Count() )
    return false;

  const int face_loop_count = brep.m_F[face_index].m_li.Count();
  if ( face_loop_count < 1 )
    return false;


  if ( brep.m_F[face_index].m_li.Count() == 1 )
  {
    rc = ON_BrepExtrudeLoop( brep, brep.m_F[face_index].m_li[0], path_curve, bCap );
  }
  else
  {
    ON_3dVector path_vector;
    ON_SimpleArray<int> side_face_index;
    ON_SimpleArray<int> side_face_index_loop_mark;
    int li, fli;

    if ( !ON_BrepExtrudeHelper_CheckPathCurve( path_curve, path_vector ) )
      return 0;

    //const int trim_count0 = brep.m_T.Count();
    const int loop_count0 = brep.m_L.Count();
    const int face_count0 = brep.m_F.Count();

    // count number of new objects so we can grow arrays
    // efficiently and use refs to dynamic array elements.
    int new_side_trim_count = 0;
    for ( fli = 0; fli < face_loop_count; fli++ )
    {
      li = brep.m_F[face_index].m_li[fli];
      if ( li < 0 || li >= loop_count0 )
        return false;
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      new_side_trim_count += brep.m_L[li].m_ti.Count();
    }
    if ( new_side_trim_count == 0 )
      return false;
    ON_BrepExtrudeHelper_ReserveSpace( brep, new_side_trim_count, bCap?1:0 );

    side_face_index.Reserve(new_side_trim_count);
    side_face_index_loop_mark.Reserve(face_loop_count);

    const ON_BrepFace& face = brep.m_F[face_index];
  
    rc = true;
    int outer_loop_index = -1;
    int outer_fli = -1;
    for ( fli = 0; fli < face_loop_count && rc; fli++ )
    {
      side_face_index_loop_mark.Append( side_face_index.Count() );
      li = face.m_li[fli];
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      ON_BrepLoop& loop = brep.m_L[li];
      if ( bCap && loop.m_type == ON_BrepLoop::outer )
      {
        if ( outer_loop_index >= 0 )
          bCap = false;
        else 
        {
          outer_loop_index = li;
          outer_fli = fli;
        }
      }
      rc = ON_BrepExtrudeHelper_MakeSides( brep, li, path_curve, bCap, side_face_index );
    }

    if ( bCap && rc && outer_loop_index >= 0 )
    {
      const int face_count1 = brep.m_F.Count();
      bCap = ON_BrepExtrudeHelper_MakeCap( 
                  brep, 
                  outer_loop_index, 
                  path_vector, 
                  side_face_index.Array() + side_face_index_loop_mark[outer_fli] );
      if ( bCap && brep.m_F.Count() > face_count1)
      {
        // put inner bondaries on the cap
        rc = 2;

        ON_BrepFace& cap_face = brep.m_F[brep.m_F.Count()-1];
        for ( fli = 0; fli < face_loop_count && rc; fli++ )
        {
          li = face.m_li[fli];
          if ( li == outer_loop_index )
            continue;
          if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
            continue;
          if ( ON_BrepExtrudeHelper_MakeTopLoop( 
                      brep, 
                      cap_face, 
                      li, 
                      path_vector,
                      side_face_index.Array() + side_face_index_loop_mark[fli] ) )
          {
            ON_BrepLoop& top_loop = brep.m_L[brep.m_L.Count()-1];
            top_loop.m_type = brep.m_L[li].m_type;
          }
        }
      }
    }

    if ( brep.m_F[face_index].m_bRev )
    {
      for ( int fi = face_count0; fi < brep.m_F.Count(); fi++ )
      {
        brep.FlipFace(brep.m_F[fi]);
      }
    }
  }

  return rc;
}